

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O1

void write_utf8(charset_spec *charset,long input_chr,charset_state *state,
               _func_void_void_ptr_long *emit,void *emitctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ulong uVar3;
  
  uVar3 = 0xffff;
  if (((input_chr & 0xfffffffffffff800U) != 0xd800 && (input_chr & 0xfffffffffffffffeU) != 0xfffe)
     && (uVar3 = input_chr, 0x7f < input_chr)) {
    uVar3 = (ulong)input_chr;
    if (input_chr < 0x800) {
      uVar1 = 0xc0;
      uVar2 = 0x1f;
    }
    else {
      if (input_chr < 0x10000) {
        uVar1 = 0xe0;
        uVar2 = 0xf;
      }
      else {
        if (input_chr < 0x200000) {
          uVar1 = 0xf0;
          uVar2 = 7;
        }
        else {
          if (input_chr < 0x4000000) {
            uVar1 = 0xf8;
            uVar2 = 3;
          }
          else {
            (*emit)(emitctx,uVar3 >> 0x1e & 1 | 0xfc);
            uVar1 = 0x80;
            uVar2 = 0x3f;
          }
          (*emit)(emitctx,(ulong)uVar2 & (ulong)((ulong)input_chr >> 0x18) & 0xff | (ulong)uVar1);
          uVar1 = 0x80;
          uVar2 = 0x3f;
        }
        (*emit)(emitctx,(ulong)uVar2 & uVar3 >> 0x12 & 0x3fff | (ulong)uVar1);
        uVar1 = 0x80;
        uVar2 = 0x3f;
      }
      (*emit)(emitctx,(ulong)uVar2 & uVar3 >> 0xc & 0xfffff | (ulong)uVar1);
      uVar1 = 0x80;
      uVar2 = 0x3f;
    }
    (*emit)(emitctx,(ulong)uVar2 & uVar3 >> 6 & 0x3ffffff | (ulong)uVar1);
    uVar3 = (ulong)((uint)input_chr & 0x3f) | 0x80;
  }
  (*emit)(emitctx,uVar3);
  return;
}

Assistant:

static void write_utf8(charset_spec const *charset, long int input_chr,
                       charset_state *state,
                       void (*emit)(void *ctx, long int output), void *emitctx)
{
    UNUSEDARG(charset);
    UNUSEDARG(state);

    /*
     * Refuse to output any illegal code points.
     */
    if (input_chr == 0xFFFE || input_chr == 0xFFFF ||
        (input_chr >= 0xD800 && input_chr < 0xE000)) {
        emit(emitctx, ERROR);
    } else if (input_chr < 0x80) {     /* one-byte character */
        emit(emitctx, input_chr);
    } else if (input_chr < 0x800) {    /* two-byte character */
        emit(emitctx, 0xC0 | (0x1F & (input_chr >>  6)));
        emit(emitctx, 0x80 | (0x3F & (input_chr      )));
    } else if (input_chr < 0x10000) {  /* three-byte character */
        emit(emitctx, 0xE0 | (0x0F & (input_chr >> 12)));
        emit(emitctx, 0x80 | (0x3F & (input_chr >>  6)));
        emit(emitctx, 0x80 | (0x3F & (input_chr      )));
    } else if (input_chr < 0x200000) { /* four-byte character */
        emit(emitctx, 0xF0 | (0x07 & (input_chr >> 18)));
        emit(emitctx, 0x80 | (0x3F & (input_chr >> 12)));
        emit(emitctx, 0x80 | (0x3F & (input_chr >>  6)));
        emit(emitctx, 0x80 | (0x3F & (input_chr      )));
    } else if (input_chr < 0x4000000) {/* five-byte character */
        emit(emitctx, 0xF8 | (0x03 & (input_chr >> 24)));
        emit(emitctx, 0x80 | (0x3F & (input_chr >> 18)));
        emit(emitctx, 0x80 | (0x3F & (input_chr >> 12)));
        emit(emitctx, 0x80 | (0x3F & (input_chr >>  6)));
        emit(emitctx, 0x80 | (0x3F & (input_chr      )));
    } else {                           /* six-byte character */
        emit(emitctx, 0xFC | (0x01 & (input_chr >> 30)));
        emit(emitctx, 0x80 | (0x3F & (input_chr >> 24)));
        emit(emitctx, 0x80 | (0x3F & (input_chr >> 18)));
        emit(emitctx, 0x80 | (0x3F & (input_chr >> 12)));
        emit(emitctx, 0x80 | (0x3F & (input_chr >>  6)));
        emit(emitctx, 0x80 | (0x3F & (input_chr      )));
    }
}